

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFindPackageCommand::SetModuleVariables
          (cmFindPackageCommand *this,string *components,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
          *componentVarDefs)

{
  string *__lhs;
  pointer ppVar1;
  size_t sVar2;
  char *pcVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *varDef;
  pointer var;
  string_view sVar4;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string quietly;
  string exact;
  string components_var;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&components_var,"CMAKE_FIND_PACKAGE_NAME",(allocator<char> *)&quietly);
  sVar4._M_str = (this->Name)._M_dataplus._M_p;
  sVar4._M_len = (this->Name)._M_string_length;
  AddFindDefinition(this,&components_var,sVar4);
  __lhs = &this->Name;
  std::__cxx11::string::~string((string *)&components_var);
  std::operator+(&components_var,__lhs,"_FIND_COMPONENTS");
  value._M_str = (components->_M_dataplus)._M_p;
  value._M_len = components->_M_string_length;
  AddFindDefinition(this,&components_var,value);
  ppVar1 = (componentVarDefs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (var = (componentVarDefs->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
             )._M_impl.super__Vector_impl_data._M_start; var != ppVar1; var = var + 1) {
    pcVar3 = var->second;
    sVar2 = strlen(pcVar3);
    value_00._M_str = pcVar3;
    value_00._M_len = sVar2;
    AddFindDefinition(this,&var->first,value_00);
  }
  if (this->Quiet != false) {
    cmStrCat<std::__cxx11::string&,char_const(&)[14]>(&quietly,__lhs,(char (*) [14])"_FIND_QUIETLY")
    ;
    value_01._M_str = "1";
    value_01._M_len = 1;
    AddFindDefinition(this,&quietly,value_01);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if (this->Required == true) {
    cmStrCat<std::__cxx11::string&,char_const(&)[15]>
              (&quietly,__lhs,(char (*) [15])"_FIND_REQUIRED");
    value_02._M_str = "1";
    value_02._M_len = 1;
    AddFindDefinition(this,&quietly,value_02);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if ((this->VersionComplete)._M_string_length != 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[23]>(&quietly,__lhs,(char (*) [23])0x6805dc);
    value_03._M_str = (this->VersionComplete)._M_dataplus._M_p;
    value_03._M_len = (this->VersionComplete)._M_string_length;
    AddFindDefinition(this,&quietly,value_03);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if ((this->Version)._M_string_length != 0) {
    exact._M_dataplus._M_p = (pointer)0xd;
    exact._M_string_length = (long)"PACKAGE_FIND_VERSION" + 7;
    cmStrCat<std::__cxx11::string&,cm::static_string_view>
              (&quietly,__lhs,(static_string_view *)&exact);
    exact._M_string_length = 0;
    exact.field_2._8_8_ =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
         ::_M_invoke;
    exact.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
         ::_M_manager;
    exact._M_dataplus._M_p = (pointer)this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&exact,&quietly,&this->Version,this->VersionCount,this->VersionMajor,
                        this->VersionMinor,this->VersionPatch,this->VersionTweak);
    std::_Function_base::~_Function_base((_Function_base *)&exact);
    cmStrCat<std::__cxx11::string&,char_const(&)[20]>
              (&exact,__lhs,(char (*) [20])"_FIND_VERSION_EXACT");
    pcVar3 = "0";
    if (this->VersionExact != false) {
      pcVar3 = "1";
    }
    value_04._M_str = pcVar3;
    value_04._M_len = 1;
    AddFindDefinition(this,&exact,value_04);
    std::__cxx11::string::~string((string *)&exact);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if ((this->VersionRange)._M_string_length != 0) {
    exact._M_dataplus._M_p = (pointer)0x11;
    exact._M_string_length = (long)"PACKAGE_FIND_VERSION_MIN" + 7;
    cmStrCat<std::__cxx11::string&,cm::static_string_view>
              (&quietly,__lhs,(static_string_view *)&exact);
    exact._M_string_length = 0;
    exact.field_2._8_8_ =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
         ::_M_invoke;
    exact.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
         ::_M_manager;
    exact._M_dataplus._M_p = (pointer)this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&exact,&quietly,&this->Version,this->VersionCount,this->VersionMajor,
                        this->VersionMinor,this->VersionPatch,this->VersionTweak);
    std::_Function_base::~_Function_base((_Function_base *)&exact);
    local_50._M_dataplus._M_p = (pointer)0x11;
    local_50._M_string_length = 0x680628;
    cmStrCat<std::__cxx11::string&,cm::static_string_view>
              (&exact,__lhs,(static_string_view *)&local_50);
    std::__cxx11::string::operator=((string *)&quietly,(string *)&exact);
    std::__cxx11::string::~string((string *)&exact);
    exact._M_string_length = 0;
    exact.field_2._8_8_ =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
         ::_M_invoke;
    exact.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
         ::_M_manager;
    exact._M_dataplus._M_p = (pointer)this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionMaxPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&exact,&quietly,&this->VersionMax,this->VersionMaxCount,
                        this->VersionMaxMajor,this->VersionMaxMinor,this->VersionMaxPatch,
                        this->VersionMaxTweak);
    std::_Function_base::~_Function_base((_Function_base *)&exact);
    cmStrCat<std::__cxx11::string&,char_const(&)[20]>(&exact,__lhs,(char (*) [20])0x680641);
    value_05._M_str = (this->VersionRange)._M_dataplus._M_p;
    value_05._M_len = (this->VersionRange)._M_string_length;
    AddFindDefinition(this,&exact,value_05);
    cmStrCat<std::__cxx11::string&,char_const(&)[24]>(&local_50,__lhs,(char (*) [24])0x68065c);
    std::__cxx11::string::operator=((string *)&exact,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    AddFindDefinition(this,&exact,this->VersionRangeMin);
    cmStrCat<std::__cxx11::string&,char_const(&)[24]>(&local_50,__lhs,(char (*) [24])0x68067b);
    std::__cxx11::string::operator=((string *)&exact,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    AddFindDefinition(this,&exact,this->VersionRangeMax);
    std::__cxx11::string::~string((string *)&exact);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if (this->RegistryViewDefined == true) {
    cmStrCat<std::__cxx11::string&,char_const(&)[20]>
              (&quietly,__lhs,(char (*) [20])"_FIND_REGISTRY_VIEW");
    sVar4 = cmWindowsRegistry::FromView((this->super_cmFindCommon).RegistryView);
    AddFindDefinition(this,&quietly,sVar4);
    std::__cxx11::string::~string((string *)&quietly);
  }
  std::__cxx11::string::~string((string *)&components_var);
  return;
}

Assistant:

void cmFindPackageCommand::SetModuleVariables(
  const std::string& components,
  const std::vector<std::pair<std::string, const char*>>& componentVarDefs)
{
  this->AddFindDefinition("CMAKE_FIND_PACKAGE_NAME", this->Name);

  // Store the list of components and associated variable definitions
  std::string components_var = this->Name + "_FIND_COMPONENTS";
  this->AddFindDefinition(components_var, components);
  for (const auto& varDef : componentVarDefs) {
    this->AddFindDefinition(varDef.first, varDef.second);
  }

  if (this->Quiet) {
    // Tell the module that is about to be read that it should find
    // quietly.
    std::string quietly = cmStrCat(this->Name, "_FIND_QUIETLY");
    this->AddFindDefinition(quietly, "1"_s);
  }

  if (this->Required) {
    // Tell the module that is about to be read that it should report
    // a fatal error if the package is not found.
    std::string req = cmStrCat(this->Name, "_FIND_REQUIRED");
    this->AddFindDefinition(req, "1"_s);
  }

  if (!this->VersionComplete.empty()) {
    std::string req = cmStrCat(this->Name, "_FIND_VERSION_COMPLETE");
    this->AddFindDefinition(req, this->VersionComplete);
  }

  // Tell the module that is about to be read what version of the
  // package has been requested.
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->AddFindDefinition(variable, value);
  };

  if (!this->Version.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    // Tell the module whether an exact version has been requested.
    auto exact = cmStrCat(this->Name, "_FIND_VERSION_EXACT");
    this->AddFindDefinition(exact, this->VersionExact ? "1"_s : "0"_s);
  }
  if (!this->VersionRange.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION_MIN"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    prefix = cmStrCat(this->Name, "_FIND_VERSION_MAX"_s);
    this->SetVersionVariables(addDefinition, prefix, this->VersionMax,
                              this->VersionMaxCount, this->VersionMaxMajor,
                              this->VersionMaxMinor, this->VersionMaxPatch,
                              this->VersionMaxTweak);

    auto id = cmStrCat(this->Name, "_FIND_VERSION_RANGE");
    this->AddFindDefinition(id, this->VersionRange);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MIN");
    this->AddFindDefinition(id, this->VersionRangeMin);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MAX");
    this->AddFindDefinition(id, this->VersionRangeMax);
  }

  if (this->RegistryViewDefined) {
    this->AddFindDefinition(cmStrCat(this->Name, "_FIND_REGISTRY_VIEW"),
                            cmWindowsRegistry::FromView(this->RegistryView));
  }
}